

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>::
HDivDirections(TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>
               *this,TPZVec<double> *pt,TPZFMatrix<double> *directions)

{
  TPZFNMatrix<9,_double> gradx;
  TPZFNMatrix<9,_double> axes;
  TPZFNMatrix<9,_double> jacinv;
  TPZFNMatrix<9,_double> jac;
  TPZFMatrix<double> local_3b0;
  double local_320 [10];
  TPZFMatrix<double> local_2d0;
  double local_240 [10];
  TPZFMatrix<double> local_1f0;
  double adStack_160 [10];
  TPZFMatrix<double> local_110;
  double local_80 [10];
  
  local_110.fElem = local_80;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_110.fSize = 9;
  local_110.fGiven = local_110.fElem;
  TPZVec<int>::TPZVec(&local_110.fPivot.super_TPZVec<int>,0);
  local_110.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_110.fPivot.super_TPZVec<int>.fStore = local_110.fPivot.fExtAlloc;
  local_110.fPivot.super_TPZVec<int>.fNElements = 0;
  local_110.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_110.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_110.fWork.fStore = (double *)0x0;
  local_110.fWork.fNElements = 0;
  local_110.fWork.fNAlloc = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  local_1f0.fElem = adStack_160;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_1f0.fSize = 9;
  local_1f0.fGiven = local_1f0.fElem;
  TPZVec<int>::TPZVec(&local_1f0.fPivot.super_TPZVec<int>,0);
  local_1f0.fPivot.super_TPZVec<int>.fStore = local_1f0.fPivot.fExtAlloc;
  local_1f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1f0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_1f0.fWork.fStore = (double *)0x0;
  local_1f0.fWork.fNElements = 0;
  local_1f0.fWork.fNAlloc = 0;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  local_2d0.fElem = local_240;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_2d0.fSize = 9;
  local_2d0.fGiven = local_2d0.fElem;
  TPZVec<int>::TPZVec(&local_2d0.fPivot.super_TPZVec<int>,0);
  local_2d0.fPivot.super_TPZVec<int>.fStore = local_2d0.fPivot.fExtAlloc;
  local_2d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_2d0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_2d0.fWork.fStore = (double *)0x0;
  local_2d0.fWork.fNElements = 0;
  local_2d0.fWork.fNAlloc = 0;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  local_3b0.fElem = local_320;
  local_3b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_3b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_3b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3b0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_3b0.fSize = 9;
  local_3b0.fGiven = local_3b0.fElem;
  TPZVec<int>::TPZVec(&local_3b0.fPivot.super_TPZVec<int>,0);
  local_3b0.fPivot.super_TPZVec<int>.fStore = local_3b0.fPivot.fExtAlloc;
  local_3b0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_3b0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3b0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3b0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_3b0.fWork.fStore = (double *)0x0;
  local_3b0.fWork.fNElements = 0;
  local_3b0.fWork.fNAlloc = 0;
  local_3b0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  TPZFMatrix<double>::operator=(&local_3b0,0.0);
  (**(code **)(*(long *)&this->super_TPZGeoEl + 0x230))(this,pt,&local_3b0);
  pztopology::TPZTriangle::ComputeHDivDirections<double>(&local_3b0,directions);
  TPZFMatrix<double>::~TPZFMatrix(&local_3b0,&PTR_PTR_0183dba8);
  TPZFMatrix<double>::~TPZFMatrix(&local_2d0,&PTR_PTR_0183dba8);
  TPZFMatrix<double>::~TPZFMatrix(&local_1f0,&PTR_PTR_0183dba8);
  TPZFMatrix<double>::~TPZFMatrix(&local_110,&PTR_PTR_0183dba8);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::HDivDirections(TPZVec<REAL> &pt, TPZFMatrix<REAL> &directions)
{
    TPZFNMatrix<9,REAL> jac(TGeo::Dimension,TGeo::Dimension), jacinv(TGeo::Dimension,TGeo::Dimension), axes(TGeo::Dimension,3), gradx(3,TGeo::Dimension,0.);
  
    this->GradX(pt, gradx);

    TGeo::ComputeHDivDirections(gradx, directions);
    
}